

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

uint anon_unknown.dwarf_ff84f::GetDerivedFromDepth(TypeClass *type,TypeClass *target)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  for (; (uVar1 = 0xffffffff, type != (TypeClass *)0x0 && (uVar1 = uVar2, type != target));
      type = type->baseClass) {
    uVar2 = uVar2 + 1;
  }
  return uVar1;
}

Assistant:

unsigned GetDerivedFromDepth(TypeClass *type, TypeClass *target)
	{
		unsigned depth = 0;

		while(type)
		{
			if(target == type)
				return depth;

			depth++;

			type = type->baseClass;
		}

		return ~0u;
	}